

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptionSetter.cpp
# Opt level: O3

void curlpp::internal::
     OptionSetter<utilspp::Functor<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>,_(CURLoption)20056>
     ::setOpt(CurlHandle *handle,ParamType value)

{
  FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  *pFVar1;
  CURLcode CVar2;
  int iVar3;
  undefined4 extraout_var;
  FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
  *pFVar5;
  long *plVar4;
  
  CVar2 = curl_easy_setopt(handle->mCurl,0x4e58,Callbacks::ProgressCallback);
  libcurlRuntimeAssert(handle->mErrorBuffer,CVar2);
  CVar2 = curl_easy_setopt(handle->mCurl,0x2749,handle);
  libcurlRuntimeAssert(handle->mErrorBuffer,CVar2);
  iVar3 = (*((value->mImpl)._M_ptr)->_vptr_FunctorImpl[1])();
  plVar4 = (long *)CONCAT44(extraout_var,iVar3);
  pFVar5 = (FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
            *)(**(code **)(*plVar4 + 8))(plVar4);
  pFVar1 = (handle->mProgressFunctor).mImpl._M_ptr;
  if (pFVar1 != pFVar5) {
    if (pFVar1 != (FunctorImpl<int,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::tl::TypeList<double,_utilspp::NullType>_>_>_>_>
                   *)0x0) {
      (*pFVar1->_vptr_FunctorImpl[3])();
    }
    (handle->mProgressFunctor).mImpl._M_ptr = pFVar5;
  }
  (**(code **)(*plVar4 + 0x18))(plVar4);
  return;
}

Assistant:

void OptionSetter<curlpp::types::ProgressFunctionFunctor, CURLOPT_PROGRESSFUNCTION>
::setOpt(internal::CurlHandle * handle, ParamType value)
{
	handle->option(CURLOPT_PROGRESSFUNCTION, Callbacks::ProgressCallback);
	handle->option(CURLOPT_PROGRESSDATA, handle);
	handle->setProgressFunctor(value);
}